

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::
argument_loader<kratos::InterfaceDefinition*,std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
::load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<kratos::InterfaceDefinition*,std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
           *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  handle hVar1;
  bool bVar2;
  reference rVar3;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  bVar2 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x40),hVar1,(*rVar3._M_p & rVar3._M_mask) != 0);
  if (bVar2) {
    hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
    bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)(this + 0x20),hVar1,(*rVar3._M_p & rVar3._M_mask) != 0);
    if (bVar2) {
      hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
      bVar2 = type_caster<unsigned_int,_void>::load
                        ((type_caster<unsigned_int,_void> *)(this + 0x18),hVar1,
                         (*rVar3._M_p & rVar3._M_mask) != 0);
      if (bVar2) {
        hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
        bVar2 = list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>
                ::load((list_caster<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>
                        *)this,hVar1,(*rVar3._M_p & rVar3._M_mask) != 0);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }